

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void fix_diffs(saucy *s,int cf,int ff)

{
  int local_20;
  int min;
  int ff_local;
  int cf_local;
  saucy *s_local;
  
  fix_diff_singleton(s,cf);
  fix_diff_singleton(s,ff);
  if (((s->right).clen[cf] != 0) && ((s->right).clen[ff] != 0)) {
    local_20 = ff;
    if ((s->right).clen[cf] < (s->right).clen[ff]) {
      local_20 = cf;
    }
    fix_diff_subtract(s,local_20,(s->left).lab,(s->right).lab);
    fix_diff_subtract(s,local_20,(s->right).lab,(s->left).lab);
  }
  return;
}

Assistant:

static void
fix_diffs(struct saucy *s, int cf, int ff)
{
    int min;

    /* Check for singleton cases in both cells */
    fix_diff_singleton(s, cf);
    fix_diff_singleton(s, ff);

    /* If they're both nonsingleton, do subtraction on smaller */
    if (s->right.clen[cf] && s->right.clen[ff]) {
        min = s->right.clen[cf] < s->right.clen[ff] ? cf : ff;
        fix_diff_subtract(s, min, s->left.lab, s->right.lab);
        fix_diff_subtract(s, min, s->right.lab, s->left.lab);
    }
}